

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::alloc
          (array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_> *this
          ,int new_len)

{
  CCountryFlag *pCVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  CCountryFlag *pCVar6;
  CTextureHandle *pCVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar14 [16];
  
  uVar11 = (ulong)(uint)new_len;
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x14),8) == 0) {
    uVar12 = SUB168(auVar2 * ZEXT816(0x14),0);
  }
  pCVar6 = (CCountryFlag *)operator_new__(uVar12);
  auVar5 = _DAT_001d7d10;
  auVar4 = _DAT_001d4f30;
  auVar2 = _DAT_001d4390;
  if (new_len != 0) {
    uVar12 = (long)new_len * 0x14 - 0x14;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar12;
    uVar13 = SUB164(auVar18 * ZEXT816(0xcccccccccccccccd),8);
    uVar16 = (undefined4)(uVar12 / 0x140000000);
    auVar14._0_8_ = CONCAT44(uVar16,uVar13);
    auVar14._8_4_ = uVar13;
    auVar14._12_4_ = uVar16;
    auVar15._0_8_ = auVar14._0_8_ >> 4;
    auVar15._8_8_ = auVar14._8_8_ >> 4;
    pCVar7 = &pCVar6[3].m_Texture;
    uVar8 = 0;
    auVar15 = auVar15 ^ _DAT_001d4390;
    do {
      auVar17._8_4_ = (int)uVar8;
      auVar17._0_8_ = uVar8;
      auVar17._12_4_ = (int)(uVar8 >> 0x20);
      auVar18 = (auVar17 | auVar4) ^ auVar2;
      iVar10 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar10 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar10 < auVar18._4_4_) & 1)) {
        pCVar7[-0xf] = -1;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        pCVar7[-10] = -1;
      }
      auVar18 = (auVar17 | auVar5) ^ auVar2;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar10 && (iVar19 != iVar10 || auVar18._0_4_ <= auVar15._0_4_)) {
        pCVar7[-5] = -1;
        pCVar7->m_Id = -1;
      }
      uVar8 = uVar8 + 4;
      pCVar7 = pCVar7 + 0x14;
    } while ((uVar12 / 0x14 + 4 & 0xfffffffffffffffc) != uVar8);
  }
  if (this->num_elements < new_len) {
    uVar11 = (ulong)(uint)this->num_elements;
  }
  pCVar1 = this->list;
  iVar10 = (int)uVar11;
  if (iVar10 < 1) {
    if (pCVar1 == (CCountryFlag *)0x0) goto LAB_0013eaf2;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined4 *)(pCVar6->m_aCountryCodeString + lVar9 + 0xc) =
           *(undefined4 *)(pCVar1->m_aCountryCodeString + lVar9 + 0xc);
      uVar3 = *(undefined8 *)(pCVar1->m_aCountryCodeString + lVar9 + -4 + 8);
      *(undefined8 *)(pCVar6->m_aCountryCodeString + lVar9 + -4) =
           *(undefined8 *)(pCVar1->m_aCountryCodeString + lVar9 + -4);
      *(undefined8 *)(pCVar6->m_aCountryCodeString + lVar9 + -4 + 8) = uVar3;
      lVar9 = lVar9 + 0x14;
    } while (uVar11 * 0x14 != lVar9);
  }
  operator_delete__(pCVar1);
  iVar10 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar10 = this->num_elements;
  }
LAB_0013eaf2:
  this->num_elements = iVar10;
  this->list = pCVar6;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}